

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

void BrotliInitZopfliNodes(ZopfliNode *array,size_t length)

{
  anon_union_4_3_cc401a1e_for_u *paVar1;
  
  if (length != 0) {
    paVar1 = &array->u;
    do {
      ((ZopfliNode *)(paVar1 + -3))->length = 1;
      ((ZopfliNode *)(paVar1 + -3))->distance = 0;
      *(undefined8 *)(paVar1 + -1) = 0x7effc99e00000000;
      paVar1 = paVar1 + 4;
      length = length - 1;
    } while (length != 0);
  }
  return;
}

Assistant:

void BrotliInitZopfliNodes(ZopfliNode* array, size_t length) {
  ZopfliNode stub;
  size_t i;
  stub.length = 1;
  stub.distance = 0;
  stub.dcode_insert_length = 0;
  stub.u.cost = kInfinity;
  for (i = 0; i < length; ++i) array[i] = stub;
}